

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_Burst(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  double dVar1;
  double dVar2;
  double dVar3;
  AActor *other;
  PClassActor *type;
  PClass *pPVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined4 extraout_var;
  PClass *pPVar10;
  undefined4 extraout_var_00;
  AActor *this;
  PClassActor *pPVar11;
  undefined4 in_register_00000014;
  undefined8 uVar12;
  undefined8 extraout_RDX;
  char *pcVar13;
  bool bVar14;
  DVector2 v;
  DVector3 local_58;
  double local_40;
  double dStack_38;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  uVar12 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar13 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      other = (AActor *)(param->field_0).field_1.a;
      if (other != (AActor *)0x0) {
        if ((other->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar5 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
          (other->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
          uVar12 = extraout_RDX;
        }
        pPVar10 = (other->super_DThinker).super_DObject.Class;
        bVar14 = pPVar10 == (PClass *)0x0;
        ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),!bVar14);
        uVar12 = CONCAT71((int7)((ulong)uVar12 >> 8),bVar14);
        defaultparam = (TArray<VMValue,_VMValue> *)
                       CONCAT71((int7)((ulong)defaultparam >> 8),pPVar10 == pPVar4 || bVar14);
        if (pPVar10 != pPVar4 && !bVar14) {
          do {
            pPVar10 = pPVar10->ParentClass;
            ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),pPVar10 != (PClass *)0x0);
            if (pPVar10 == pPVar4) break;
          } while (pPVar10 != (PClass *)0x0);
        }
        if ((char)ret == '\0') {
          pcVar13 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d56ff;
        }
      }
      if (numparam == 1) {
        pcVar13 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          type = (PClassActor *)param[1].field_0.field_1.a;
          if (type != (PClassActor *)0x0) {
            pPVar11 = type;
            if (type != (PClassActor *)AActor::RegistrationInfo.MyClass) {
              do {
                ret = (VMReturn *)(pPVar11->super_PClass).ParentClass;
                if ((PClass *)ret == AActor::RegistrationInfo.MyClass) break;
                pPVar11 = (PClassActor *)ret;
              } while ((PClassActor *)ret != (PClassActor *)0x0);
              if ((PClassActor *)ret == (PClassActor *)0x0) {
                pcVar13 = "chunk == NULL || chunk->IsDescendantOf(RUNTIME_CLASS(AActor))";
                goto LAB_003d571e;
              }
            }
            (other->Vel).X = 0.0;
            (other->Vel).Y = 0.0;
            (other->Vel).Z = 0.0;
            if ((other->super_DThinker).super_DObject.Class == (PClass *)0x0) {
              iVar5 = (**(other->super_DThinker).super_DObject._vptr_DObject)
                                (other,defaultparam,uVar12,ret);
              (other->super_DThinker).super_DObject.Class =
                   (PClass *)CONCAT44(extraout_var_00,iVar5);
            }
            dVar1 = *(double *)(((other->super_DThinker).super_DObject.Class)->Defaults + 0x180);
            other->Height = dVar1;
            iVar6 = (int)(dVar1 * other->radius);
            iVar5 = iVar6 + 0x1f;
            if (-1 < iVar6) {
              iVar5 = iVar6;
            }
            uVar9 = 4;
            if (4 < iVar5 >> 5) {
              uVar9 = iVar5 >> 5;
            }
            uVar7 = FRandom::GenRand32(&pr_burst);
            uVar8 = FRandom::GenRand32(&pr_burst);
            iVar6 = (int)((uVar7 & 0xff) - (uVar8 & 0xff)) % (int)(uVar9 >> 2) + uVar9;
            iVar5 = 0x18;
            if (0x18 < iVar6) {
              iVar5 = iVar6;
            }
            iVar5 = iVar5 + 1;
            do {
              uVar9 = FRandom::GenRand32(&pr_burst);
              dVar1 = other->radius;
              uVar7 = FRandom::GenRand32(&pr_burst);
              dVar2 = other->radius;
              uVar8 = FRandom::GenRand32(&pr_burst);
              dVar3 = other->Height;
              P_GetOffsetPosition((other->__Pos).X,(other->__Pos).Y,
                                  (double)(int)((uVar9 & 0xff) - 0x80) * dVar1 * 0.0078125,
                                  (double)(int)((uVar7 & 0xff) - 0x80) * dVar2 * 0.0078125);
              local_58.Z = ((double)(uVar8 & 0xff) * dVar3) / 255.0 + (other->__Pos).Z;
              local_58.X = local_40;
              local_58.Y = dStack_38;
              this = AActor::StaticSpawn(type,&local_58,ALLOW_REPLACE,false);
              if (this != (AActor *)0x0) {
                (this->Vel).Z = (((this->__Pos).Z - (other->__Pos).Z) * 4.0) / other->Height;
                uVar9 = FRandom::GenRand32(&pr_burst);
                uVar7 = FRandom::GenRand32(&pr_burst);
                (this->Vel).X = (double)(int)((uVar9 & 0xff) - (uVar7 & 0xff)) * 0.0078125;
                uVar9 = FRandom::GenRand32(&pr_burst);
                uVar7 = FRandom::GenRand32(&pr_burst);
                (this->Vel).Y = (double)(int)((uVar9 & 0xff) - (uVar7 & 0xff)) * 0.0078125;
                this->RenderStyle = other->RenderStyle;
                this->Alpha = other->Alpha;
                AActor::CopyFriendliness(this,other,true,true);
              }
              iVar6 = iVar5 + -1;
              bVar14 = 0 < iVar5;
              iVar5 = iVar6;
            } while (iVar6 != 0 && bVar14);
            if (((other->flags4).Value & 8) != 0) {
              A_BossDeath(other);
            }
            A_Unblock(other,true);
            (*(other->super_DThinker).super_DObject._vptr_DObject[4])(other);
          }
          return 0;
        }
        pcVar13 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_003d571e:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xe96,
                    "int AF_AActor_A_Burst(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d56ff:
  __assert_fail(pcVar13,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe95,"int AF_AActor_A_Burst(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Burst)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(chunk, AActor);

	int i, numChunks;
	AActor * mo;

	if (chunk == NULL)
	{
		return 0;
	}

	self->Vel.Zero();
	self->Height = self->GetDefault()->Height;

	// [RH] In Hexen, this creates a random number of shards (range [24,56])
	// with no relation to the size of the self shattering. I think it should
	// base the number of shards on the size of the dead thing, so bigger
	// things break up into more shards than smaller things.
	// An self with radius 20 and height 64 creates ~40 chunks.
	numChunks = MAX<int> (4, int(self->radius * self->Height)/32);
	i = (pr_burst.Random2()) % (numChunks/4);
	for (i = MAX (24, numChunks + i); i >= 0; i--)
	{
		double xo = (pr_burst() - 128) * self->radius / 128;
		double yo = (pr_burst() - 128) * self->radius / 128;
		double zo = (pr_burst() * self->Height / 255);
		mo = Spawn(chunk, self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);

		if (mo)
		{
			mo->Vel.Z = 4 * (mo->Z() - self->Z()) / self->Height;
			mo->Vel.X = pr_burst.Random2() / 128.;
			mo->Vel.Y = pr_burst.Random2() / 128.;
			mo->RenderStyle = self->RenderStyle;
			mo->Alpha = self->Alpha;
			mo->CopyFriendliness(self, true);
		}
	}

	// [RH] Do some stuff to make this more useful outside Hexen
	if (self->flags4 & MF4_BOSSDEATH)
	{
		A_BossDeath(self);
	}
	A_Unblock(self, true);

	self->Destroy ();
	return 0;
}